

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O1

void ontostack(bucket_conflict1 *b,int pos)

{
  int iVar1;
  list plVar2;
  list plVar3;
  stack *psVar4;
  
  b->tail->next = (list)0x0;
  if (b->size < 0x15) {
    if (1 < b->size) {
      plVar3 = ListInsertsort(b->head,&b->tail,pos);
      b->head = plVar3;
    }
    b->size = 0;
  }
  psVar4 = stackp;
  iVar1 = b->size;
  if (((iVar1 == 0) && (stackp != (stack *)0x0)) && (stackp->size == 0)) {
    stackp->tail->next = b->head;
    psVar4->tail = b->tail;
  }
  else {
    plVar3 = b->head;
    plVar2 = b->tail;
    psVar4 = (stack *)allocmem(stackmem,0x18);
    stackp = psVar4;
    psVar4->head = plVar3;
    psVar4->tail = plVar2;
    psVar4->size = iVar1;
    psVar4->pos = pos;
    b->size = 0;
  }
  b->head = (list)0x0;
  return;
}

Assistant:

static void ontostack(bucket *b, int pos)
{
   b->tail->next = NULL;
   if (b->size <= INSERTBREAK) {
      if (b->size > 1)
         b->head = ListInsertsort(b->head, &b->tail, pos);
      b->size = 0; /* finished */
   }
   if (!b->size && !stackempty() && !top()->size) {
      top()->tail->next = b->head;
      top()->tail = b->tail;
   }
   else {
      push(b->head, b->tail, b->size, pos);
      b->size = 0;
   }
   b->head = NULL;
}